

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.h
# Opt level: O2

void __thiscall pmx::PmxBone::~PmxBone(PmxBone *this)

{
  std::unique_ptr<pmx::PmxIkLink[],_std::default_delete<pmx::PmxIkLink[]>_>::~unique_ptr
            (&this->ik_links);
  std::__cxx11::string::~string((string *)&this->bone_english_name);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

PmxBone()
			: parent_index(0)
			, level(0)
			, bone_flag(0)
			, target_index(0)
			, grant_parent_index(0)
			, grant_weight(0.0f)
			, key(0)
			, ik_target_bone_index(0)
			, ik_loop(0)
			, ik_loop_angle_limit(0.0f)
			, ik_link_count(0)
		{
			for (int i = 0; i < 3; ++i) {
				position[i] = 0.0f;
				offset[i] = 0.0f;
				lock_axis_orientation[i] = 0.0f;
				local_axis_x_orientation[i] = 0.0f;
				local_axis_y_orientation[i] = 0.0f;
			}
		}